

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_WriteFullAdder(FILE *pFile)

{
  fwrite(".model FA\n",10,1,(FILE *)pFile);
  fwrite(".inputs a b cin\n",0x10,1,(FILE *)pFile);
  fwrite(".outputs s cout\n",0x10,1,(FILE *)pFile);
  fwrite(".names a b and1\n",0x10,1,(FILE *)pFile);
  fwrite("11 1\n",5,1,(FILE *)pFile);
  fwrite(".names a b and1_\n",0x11,1,(FILE *)pFile);
  fwrite("00 1\n",5,1,(FILE *)pFile);
  fwrite(".names and1 and1_ xor\n",0x16,1,(FILE *)pFile);
  fwrite("00 1\n",5,1,(FILE *)pFile);
  fwrite(".names cin xor and2\n",0x14,1,(FILE *)pFile);
  fwrite("11 1\n",5,1,(FILE *)pFile);
  fwrite(".names cin xor and2_\n",0x15,1,(FILE *)pFile);
  fwrite("00 1\n",5,1,(FILE *)pFile);
  fwrite(".names and2 and2_ s\n",0x14,1,(FILE *)pFile);
  fwrite("00 1\n",5,1,(FILE *)pFile);
  fwrite(".names and1 and2 cout\n",0x16,1,(FILE *)pFile);
  fwrite("00 0\n",5,1,(FILE *)pFile);
  fwrite(".end\n",5,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_WriteFullAdder( FILE * pFile )
{
    int fNaive = 0;
    fprintf( pFile, ".model FA\n" );
    fprintf( pFile, ".inputs a b cin\n" ); 
    fprintf( pFile, ".outputs s cout\n" ); 
    if ( fNaive )
    {
        fprintf( pFile, ".names a b k\n" ); 
        fprintf( pFile, "10 1\n" ); 
        fprintf( pFile, "01 1\n" ); 
        fprintf( pFile, ".names k cin s\n" ); 
        fprintf( pFile, "10 1\n" ); 
        fprintf( pFile, "01 1\n" ); 
        fprintf( pFile, ".names a b cin cout\n" ); 
        fprintf( pFile, "11- 1\n" ); 
        fprintf( pFile, "1-1 1\n" ); 
        fprintf( pFile, "-11 1\n" ); 
    }
    else
    {
        fprintf( pFile, ".names a b and1\n" ); 
        fprintf( pFile, "11 1\n" ); 
        fprintf( pFile, ".names a b and1_\n" ); 
        fprintf( pFile, "00 1\n" ); 
        fprintf( pFile, ".names and1 and1_ xor\n" ); 
        fprintf( pFile, "00 1\n" ); 

        fprintf( pFile, ".names cin xor and2\n" ); 
        fprintf( pFile, "11 1\n" ); 
        fprintf( pFile, ".names cin xor and2_\n" ); 
        fprintf( pFile, "00 1\n" ); 
        fprintf( pFile, ".names and2 and2_ s\n" ); 
        fprintf( pFile, "00 1\n" ); 

        fprintf( pFile, ".names and1 and2 cout\n" ); 
        fprintf( pFile, "00 0\n" ); 
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}